

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

void store_winner_mode_stats
               (AV1_COMMON *cm,MACROBLOCK *x,MB_MODE_INFO *mbmi,RD_STATS *rd_cost,
               RD_STATS *rd_cost_y,RD_STATS *rd_cost_uv,THR_MODES mode_index,uint8_t *color_map,
               BLOCK_SIZE bsize,int64_t this_rd,int multi_winner_mode_type,int txfm_search_done)

{
  uint uVar1;
  WinnerModeStats *pWVar2;
  uint uVar3;
  ulong uVar4;
  int64_t *piVar5;
  ulong uVar6;
  
  if ((rd_cost != (RD_STATS *)0x7fffffffffffffff && (int)rd_cost_y != 0) &&
     ((pWVar2 = x->winner_mode_stats, ((cm->current_frame).frame_type & 0xfd) == 0 ||
      ((mbmi->palette_mode_info).palette_size[0] == '\0')))) {
    uVar1 = winner_mode_count_allowed[(ulong)rd_cost_y & 0xffffffff];
    uVar3 = x->winner_mode_count;
    if (uVar3 == 0) {
      uVar6 = 0;
    }
    else {
      uVar4 = 0;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar4;
      }
      piVar5 = &pWVar2->rd;
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        if ((long)rd_cost < *piVar5) {
          uVar6 = uVar4 & 0xffffffff;
          break;
        }
        piVar5 = piVar5 + 0x81e;
      }
      uVar3 = (uint)uVar6;
      if (uVar3 == uVar1) {
        return;
      }
      if ((int)uVar3 < (int)(uVar1 - 1)) {
        memmove(pWVar2 + uVar6 + 1,pWVar2 + uVar6,(long)(int)(~uVar3 + uVar1) * 0x40f0);
      }
    }
    memcpy(pWVar2 + uVar6,mbmi,0xb0);
    pWVar2[uVar6].rd = (int64_t)rd_cost;
    pWVar2[uVar6].mode_index = '\0';
    uVar3 = x->winner_mode_count + 1;
    if ((int)uVar1 <= (int)uVar3) {
      uVar3 = uVar1;
    }
    x->winner_mode_count = uVar3;
  }
  return;
}

Assistant:

static inline void store_winner_mode_stats(
    const AV1_COMMON *const cm, MACROBLOCK *x, const MB_MODE_INFO *mbmi,
    RD_STATS *rd_cost, RD_STATS *rd_cost_y, RD_STATS *rd_cost_uv,
    THR_MODES mode_index, uint8_t *color_map, BLOCK_SIZE bsize, int64_t this_rd,
    int multi_winner_mode_type, int txfm_search_done) {
  WinnerModeStats *winner_mode_stats = x->winner_mode_stats;
  int mode_idx = 0;
  int is_palette_mode = mbmi->palette_mode_info.palette_size[PLANE_TYPE_Y] > 0;
  // Mode stat is not required when multiwinner mode processing is disabled
  if (multi_winner_mode_type == MULTI_WINNER_MODE_OFF) return;
  // Ignore mode with maximum rd
  if (this_rd == INT64_MAX) return;
  // TODO(any): Winner mode processing is currently not applicable for palette
  // mode in Inter frames. Clean-up the following code, once support is added
  if (!frame_is_intra_only(cm) && is_palette_mode) return;

  int max_winner_mode_count = winner_mode_count_allowed[multi_winner_mode_type];
  assert(x->winner_mode_count >= 0 &&
         x->winner_mode_count <= max_winner_mode_count);

  if (x->winner_mode_count) {
    // Find the mode which has higher rd cost than this_rd
    for (mode_idx = 0; mode_idx < x->winner_mode_count; mode_idx++)
      if (winner_mode_stats[mode_idx].rd > this_rd) break;

    if (mode_idx == max_winner_mode_count) {
      // No mode has higher rd cost than this_rd
      return;
    } else if (mode_idx < max_winner_mode_count - 1) {
      // Create a slot for current mode and move others to the next slot
      memmove(
          &winner_mode_stats[mode_idx + 1], &winner_mode_stats[mode_idx],
          (max_winner_mode_count - mode_idx - 1) * sizeof(*winner_mode_stats));
    }
  }
  // Add a mode stat for winner mode processing
  winner_mode_stats[mode_idx].mbmi = *mbmi;
  winner_mode_stats[mode_idx].rd = this_rd;
  winner_mode_stats[mode_idx].mode_index = mode_index;

  // Update rd stats required for inter frame
  if (!frame_is_intra_only(cm) && rd_cost && rd_cost_y && rd_cost_uv) {
    const MACROBLOCKD *xd = &x->e_mbd;
    const int skip_ctx = av1_get_skip_txfm_context(xd);
    const int is_intra_mode = av1_mode_defs[mode_index].mode < INTRA_MODE_END;
    const int skip_txfm = mbmi->skip_txfm && !is_intra_mode;

    winner_mode_stats[mode_idx].rd_cost = *rd_cost;
    if (txfm_search_done) {
      winner_mode_stats[mode_idx].rate_y =
          rd_cost_y->rate +
          x->mode_costs
              .skip_txfm_cost[skip_ctx][rd_cost->skip_txfm || skip_txfm];
      winner_mode_stats[mode_idx].rate_uv = rd_cost_uv->rate;
    }
  }

  if (color_map) {
    // Store color_index_map for palette mode
    const MACROBLOCKD *const xd = &x->e_mbd;
    int block_width, block_height;
    av1_get_block_dimensions(bsize, AOM_PLANE_Y, xd, &block_width,
                             &block_height, NULL, NULL);
    memcpy(winner_mode_stats[mode_idx].color_index_map, color_map,
           block_width * block_height * sizeof(color_map[0]));
  }

  x->winner_mode_count =
      AOMMIN(x->winner_mode_count + 1, max_winner_mode_count);
}